

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_block.c
# Opt level: O3

void sig_block(int sig)

{
  sigset_t ss;
  sigset_t local_90;
  
  sigemptyset(&local_90);
  sigaddset(&local_90,sig);
  sigprocmask(0,&local_90,(sigset_t *)0x0);
  return;
}

Assistant:

void sig_block(int sig)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigaddset(&ss,sig);
  sigprocmask(SIG_BLOCK,&ss,(sigset_t *) 0);
#else
  sigblock(1 << (sig - 1));
#endif
}